

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O2

RigidBody * __thiscall
OpenMD::MoleculeCreator::createRigidBody
          (MoleculeCreator *this,MoleculeStamp *molStamp,Molecule *mol,RigidBodyStamp *rbStamp,
          LocalIndexManager *localIndexMan)

{
  pointer piVar1;
  pointer piVar2;
  Atom *at;
  uint uVar3;
  int iVar4;
  RigidBody *this_00;
  RigidBodyStamp *pRVar5;
  size_t i;
  long lVar6;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string s;
  Vector3d refCoor;
  
  pRVar5 = rbStamp;
  Vector<double,_3U>::Vector(&refCoor.super_Vector<double,_3U>);
  this_00 = (RigidBody *)operator_new(0x188);
  RigidBody::RigidBody(this_00);
  piVar1 = (rbStamp->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (rbStamp->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = 0; uVar3 = (uint)pRVar5, (long)piVar1 - (long)piVar2 >> 2 != lVar6; lVar6 = lVar6 + 1
      ) {
    uVar3 = RigidBodyStamp::getMemberAt(rbStamp,(int)lVar6);
    at = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
         super__Vector_impl_data._M_start[uVar3];
    iVar4 = RigidBodyStamp::getMemberAt(rbStamp,(int)lVar6);
    pRVar5 = (RigidBodyStamp *)
             (molStamp->atomStamps_).
             super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
    RigidBody::addAtom(this_00,at,(AtomStamp *)(&(pRVar5->super_DataHolder)._vptr_DataHolder)[iVar4]
                      );
  }
  RigidBody::calcRefCoords(this_00);
  iVar4 = IndexListContainer::pop(&localIndexMan->rigidBodyIndexContainer_);
  (this_00->super_StuntDouble).localIndex_ = iVar4;
  OpenMD_itoa_abi_cxx11_
            (&s,(OpenMD *)
                ((ulong)((long)(mol->rigidBodies_).
                               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(mol->rigidBodies_).
                              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3),10,uVar3);
  Molecule::getType_abi_cxx11_(&local_c8,mol);
  std::operator+(&local_a8,&local_c8,"_RB_");
  std::operator+(&local_88,&local_a8,s._M_dataplus._M_p);
  (*(this_00->super_StuntDouble)._vptr_StuntDouble[8])(this_00,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&s);
  return this_00;
}

Assistant:

RigidBody* MoleculeCreator::createRigidBody(
      MoleculeStamp* molStamp, Molecule* mol, RigidBodyStamp* rbStamp,
      LocalIndexManager* localIndexMan) {
    Atom* atom;
    size_t nAtoms;
    Vector3d refCoor;
    AtomStamp* atomStamp;

    RigidBody* rb = new RigidBody();
    nAtoms        = rbStamp->getNMembers();
    for (std::size_t i = 0; i < nAtoms; ++i) {
      // rbStamp->getMember(i) return the local index of current atom
      // inside the molecule.  It is not the same as local index of
      // atom which is the index of atom at DataStorage class
      atom      = mol->getAtomAt(rbStamp->getMemberAt(i));
      atomStamp = molStamp->getAtomStamp(rbStamp->getMemberAt(i));
      rb->addAtom(atom, atomStamp);
    }

    // after all of the atoms are added, we need to calculate the
    // reference coordinates
    rb->calcRefCoords();

    // set the local index of this rigid body, global index will be set later
    rb->setLocalIndex(localIndexMan->getNextRigidBodyIndex());

    // The rule for naming a rigidbody is: MoleculeName_RB_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "RB"
    // The third part is the index of the rigidbody defined in meta-data file
    // For example, Butane_RB_0 is a valid rigid body name of butane molecule

    std::string s = OpenMD_itoa(mol->getNRigidBodies(), 10);
    rb->setType(mol->getType() + "_RB_" + s.c_str());
    return rb;
  }